

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Errors::RBDLSizeMismatchError::~RBDLSizeMismatchError
          (RBDLSizeMismatchError *this)

{
  void *in_RDI;
  
  ~RBDLSizeMismatchError((RBDLSizeMismatchError *)0x6da5a8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLSizeMismatchError : public RBDLError
{
public:
  RBDLSizeMismatchError(std::string text);
}